

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  mapped_type_conflict *pmVar5;
  mapped_type *pmVar6;
  string *psVar7;
  reference __k;
  mapped_type_conflict2 *pmVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  string *i;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  iterator local_170;
  size_type local_168;
  undefined1 local_160 [8];
  cmList extensionList;
  string ignoreExts;
  string ignoreExtensionsVar;
  string_view local_e8;
  string_view local_d8;
  undefined1 local_c8 [8];
  string outputExtension;
  cmValue p;
  string outputExtensionVar;
  string msg;
  int local_58 [2];
  int preference;
  cmValue local_48;
  cmValue linkerPref;
  string linkerPrefVar;
  cmMakefile *mf_local;
  string *l_local;
  cmGlobalGenerator *this_local;
  
  bVar1 = ::cm::
          contains<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&this->LanguageToLinkerPreference,l);
  if (!bVar1) {
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
              ((string *)&linkerPref,(char (*) [7])0x1244722,l,(char (*) [19])"_LINKER_PREFERENCE");
    local_48 = cmMakefile::GetDefinition(mf,(string *)&linkerPref);
    local_58[0] = 0;
    bVar1 = cmNonempty(local_48);
    if (bVar1) {
      cmValue::operator->[abi_cxx11_(&local_48);
      uVar3 = std::__cxx11::string::c_str();
      iVar2 = __isoc99_sscanf(uVar3,"%d",local_58);
      if (iVar2 != 1) {
        psVar7 = cmValue::operator*[abi_cxx11_(&local_48);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar7);
        if (*pcVar4 == 'P') {
          local_58[0] = 100;
        }
        else {
          local_58[0] = 0;
        }
      }
    }
    if (local_58[0] < 0) {
      cmStrCat<std::__cxx11::string&,char_const(&)[32]>
                ((string *)((long)&outputExtensionVar.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&linkerPref,
                 (char (*) [32])" is negative, adjusting it to 0");
      cmSystemTools::Message((string *)((long)&outputExtensionVar.field_2 + 8),"Warning");
      local_58[0] = 0;
      std::__cxx11::string::~string((string *)(outputExtensionVar.field_2._M_local_buf + 8));
    }
    iVar2 = local_58[0];
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->LanguageToLinkerPreference,l);
    *pmVar5 = iVar2;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
              ((string *)&p,(char (*) [7])0x1244722,l,(char (*) [18])0x126a066);
    outputExtension.field_2._8_8_ = cmMakefile::GetDefinition(mf,(string *)&p);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&outputExtension.field_2 + 8));
    if (bVar1) {
      psVar7 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&outputExtension.field_2 + 8));
      std::__cxx11::string::string((string *)local_c8,(string *)psVar7);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->LanguageToOutputExtension,l);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)local_c8);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->OutputExtensions,(key_type *)local_c8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)local_c8);
      local_d8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,".");
      bVar1 = cmHasPrefix(local_d8,local_e8);
      if (bVar1) {
        std::__cxx11::string::substr
                  ((ulong)((long)&ignoreExtensionsVar.field_2 + 8),(ulong)local_c8);
        std::__cxx11::string::operator=
                  ((string *)local_c8,(string *)(ignoreExtensionsVar.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(ignoreExtensionsVar.field_2._M_local_buf + 8));
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->OutputExtensions,(key_type *)local_c8);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)local_c8);
      }
      std::__cxx11::string::~string((string *)local_c8);
    }
    FillExtensionToLanguageMap(this,l,mf);
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
              ((string *)((long)&ignoreExts.field_2 + 8),(char (*) [7])0x1244722,l,
               (char (*) [19])"_IGNORE_EXTENSIONS");
    psVar7 = cmMakefile::GetSafeDefinition(mf,(string *)((long)&ignoreExts.field_2 + 8));
    std::__cxx11::string::string
              ((string *)
               &extensionList.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar7);
    std::__cxx11::string::string
              ((string *)&local_190,
               (string *)
               &extensionList.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_170 = &local_190;
    local_168 = 1;
    init._M_len = 1;
    init._M_array = local_170;
    cmList::cmList((cmList *)local_160,init);
    local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
    do {
      local_230 = local_230 + -1;
      std::__cxx11::string::~string((string *)local_230);
    } while (local_230 != &local_190);
    __end1 = cmList::begin_abi_cxx11_((cmList *)local_160);
    i = (string *)cmList::end_abi_cxx11_((cmList *)local_160);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&i);
      if (!bVar1) break;
      __k = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](&this->IgnoreExtensions,__k);
      *pmVar8 = true;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    cmList::~cmList((cmList *)local_160);
    std::__cxx11::string::~string
              ((string *)
               &extensionList.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(ignoreExts.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)&linkerPref);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (cm::contains(this->LanguageToLinkerPreference, l)) {
    return;
  }

  std::string linkerPrefVar = cmStrCat("CMAKE_", l, "_LINKER_PREFERENCE");
  cmValue linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if (cmNonempty(linkerPref)) {
    if (sscanf(linkerPref->c_str(), "%d", &preference) != 1) {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if ((*linkerPref)[0] == 'P') {
        preference = 100;
      } else {
        preference = 0;
      }
    }
  }

  if (preference < 0) {
    std::string msg =
      cmStrCat(linkerPrefVar, " is negative, adjusting it to 0");
    cmSystemTools::Message(msg, "Warning");
    preference = 0;
  }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar = cmStrCat("CMAKE_", l, "_OUTPUT_EXTENSION");
  if (cmValue p = mf->GetDefinition(outputExtensionVar)) {
    std::string outputExtension = *p;
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if (cmHasPrefix(outputExtension, ".")) {
      outputExtension = outputExtension.substr(1);
      this->OutputExtensions[outputExtension] = outputExtension;
    }
  }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar =
    cmStrCat("CMAKE_", l, "_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  cmList extensionList{ ignoreExts };
  for (std::string const& i : extensionList) {
    this->IgnoreExtensions[i] = true;
  }
}